

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O0

int32 hmm_vit_eval_5st_lr(hmm_t *hmm)

{
  int32 *piVar1;
  int *piVar2;
  short *psVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_5c;
  int local_50;
  int32 bestScore;
  int32 t0;
  int32 t1;
  int32 t2;
  int32 s0;
  int32 s1;
  int32 s2;
  int32 s3;
  int32 s4;
  int32 s5;
  s3senid_t *sseq;
  int32 *tp;
  int32 *senscore;
  hmm_t *hmm_local;
  
  piVar1 = hmm->ctx->senscore;
  piVar2 = *hmm->ctx->tp[hmm->tmatid];
  if (hmm->mpx == '\0') {
    local_5c = (hmm->s).ssid;
  }
  else {
    local_5c = *(hmm->s).mpx_ssid;
  }
  psVar3 = hmm->ctx->sseq[local_5c];
  local_50 = -0x38000000;
  s2 = hmm->state[4].score + piVar1[psVar3[4]];
  iVar4 = hmm->state[3].score + piVar1[psVar3[3]];
  if (s2 < -0x38000000) {
    s2 = -0x38000000;
  }
  if (-0x38000000 < iVar4) {
    iVar5 = piVar2[0x1d];
    s3 = iVar4 + piVar2[0x17];
    if (s3 < s2 + iVar5) {
      (hmm->out).history = hmm->state[4].history;
      s3 = s2 + iVar5;
    }
    else {
      (hmm->out).history = hmm->state[3].history;
    }
    if (s3 < -0x38000000) {
      s3 = -0x38000000;
    }
    (hmm->out).score = s3;
    local_50 = s3;
  }
  iVar5 = hmm->state[2].score + piVar1[psVar3[2]];
  if (-0x38000000 < iVar5) {
    s2 = s2 + piVar2[0x1c];
    iVar6 = iVar4 + piVar2[0x16];
    iVar7 = iVar5 + piVar2[0x10];
    if (iVar6 < s2) {
      if (s2 < iVar7) {
        hmm->state[4].history = hmm->state[2].history;
        s2 = iVar7;
      }
    }
    else if (iVar6 < iVar7) {
      hmm->state[4].history = hmm->state[2].history;
      s2 = iVar7;
    }
    else {
      hmm->state[4].history = hmm->state[3].history;
      s2 = iVar6;
    }
    if (s2 < -0x38000000) {
      s2 = -0x38000000;
    }
    if (local_50 < s2) {
      local_50 = s2;
    }
    hmm->state[4].score = s2;
  }
  iVar6 = hmm->state[1].score + piVar1[psVar3[1]];
  if (-0x38000000 < iVar6) {
    s1 = iVar4 + piVar2[0x15];
    iVar4 = iVar5 + piVar2[0xf];
    iVar7 = iVar6 + piVar2[9];
    if (iVar4 < s1) {
      if (s1 < iVar7) {
        hmm->state[3].history = hmm->state[1].history;
        s1 = iVar7;
      }
    }
    else if (iVar4 < iVar7) {
      hmm->state[3].history = hmm->state[1].history;
      s1 = iVar7;
    }
    else {
      hmm->state[3].history = hmm->state[2].history;
      s1 = iVar4;
    }
    if (s1 < -0x38000000) {
      s1 = -0x38000000;
    }
    if (local_50 < s1) {
      local_50 = s1;
    }
    hmm->state[3].score = s1;
  }
  iVar4 = hmm->state[0].score + piVar1[*psVar3];
  s0 = iVar5 + piVar2[0xe];
  iVar5 = iVar6 + piVar2[8];
  iVar7 = iVar4 + piVar2[2];
  if (iVar5 < s0) {
    if (s0 < iVar7) {
      hmm->state[2].history = hmm->state[0].history;
      s0 = iVar7;
    }
  }
  else if (iVar5 < iVar7) {
    hmm->state[2].history = hmm->state[0].history;
    s0 = iVar7;
  }
  else {
    hmm->state[2].history = hmm->state[1].history;
    s0 = iVar5;
  }
  if (s0 < -0x38000000) {
    s0 = -0x38000000;
  }
  if (local_50 < s0) {
    local_50 = s0;
  }
  hmm->state[2].score = s0;
  t2 = iVar6 + piVar2[7];
  iVar5 = piVar2[1];
  if (t2 <= iVar4 + iVar5) {
    hmm->state[1].history = hmm->state[0].history;
    t2 = iVar4 + iVar5;
  }
  if (t2 < -0x38000000) {
    t2 = -0x38000000;
  }
  if (local_50 < t2) {
    local_50 = t2;
  }
  hmm->state[1].score = t2;
  t1 = iVar4 + *piVar2;
  if (t1 < -0x38000000) {
    t1 = -0x38000000;
  }
  if (local_50 < t1) {
    local_50 = t1;
  }
  hmm->state[0].score = t1;
  hmm->bestscore = local_50;
  return local_50;
}

Assistant:

static int32
hmm_vit_eval_5st_lr(hmm_t * hmm)
{
    const int32 *senscore = hmm->ctx->senscore;
    const int32 *tp = hmm->ctx->tp[hmm->tmatid][0];
    const s3senid_t *sseq = hmm->ctx->sseq[hmm_ssid(hmm, 0)];
    int32 s5, s4, s3, s2, s1, s0, t2, t1, t0, bestScore;

    /* It was the best of scores, it was the worst of scores. */
    bestScore = WORST_SCORE;

    s4 = hmm_score(hmm, 4) + nonmpx_senscr(4);
    s3 = hmm_score(hmm, 3) + nonmpx_senscr(3);
    
    /* Avoid wraparound */
    if (s4 < WORST_SCORE)
	s4 = WORST_SCORE;

    /* Transitions into non-emitting state 5 */
    if (s3 > WORST_SCORE) {
        t1 = s4 + hmm_tprob_5st(4, 5);
        t2 = s3 + hmm_tprob_5st(3, 5);
        if (t1 > t2) {
            s5 = t1;
            hmm_out_history(hmm)  = hmm_history(hmm, 4);
        } else {
            s5 = t2;
            hmm_out_history(hmm)  = hmm_history(hmm, 3);
        }
        if (s5 < WORST_SCORE) s5 = WORST_SCORE;
        hmm_out_score(hmm) = s5;
        bestScore = s5;
    }

    s2 = hmm_score(hmm, 2) + nonmpx_senscr(2);
    /* All transitions into state 4 */
    if (s2 > WORST_SCORE) {
        t0 = s4 + hmm_tprob_5st(4, 4);
        t1 = s3 + hmm_tprob_5st(3, 4);
        t2 = s2 + hmm_tprob_5st(2, 4);
        if (t0 > t1) {
            if (t2 > t0) {
                s4 = t2;
                hmm_history(hmm, 4)  = hmm_history(hmm, 2);
            } else
                s4 = t0;
        } else {
            if (t2 > t1) {
                s4 = t2;
                hmm_history(hmm, 4)  = hmm_history(hmm, 2);
            } else {
                s4 = t1;
                hmm_history(hmm, 4)  = hmm_history(hmm, 3);
            }
        }
        if (s4 < WORST_SCORE) s4 = WORST_SCORE;
        if (s4 > bestScore) bestScore = s4;
        hmm_score(hmm, 4) = s4;
    }

    s1 = hmm_score(hmm, 1) + nonmpx_senscr(1);
    /* All transitions into state 3 */
    if (s1 > WORST_SCORE) {
        t0 = s3 + hmm_tprob_5st(3, 3);
        t1 = s2 + hmm_tprob_5st(2, 3);
        t2 = s1 + hmm_tprob_5st(1, 3);
        if (t0 > t1) {
            if (t2 > t0) {
                s3 = t2;
                hmm_history(hmm, 3)  = hmm_history(hmm, 1);
            } else
                s3 = t0;
        } else {
            if (t2 > t1) {
                s3 = t2;
                hmm_history(hmm, 3)  = hmm_history(hmm, 1);
            } else {
                s3 = t1;
                hmm_history(hmm, 3)  = hmm_history(hmm, 2);
            }
        }
        if (s3 < WORST_SCORE) s3 = WORST_SCORE;
        if (s3 > bestScore) bestScore = s3;
        hmm_score(hmm, 3) = s3;
    }

    s0 = hmm_in_score(hmm) + nonmpx_senscr(0);
    /* All transitions into state 2 (state 0 is always active) */
    t0 = s2 + hmm_tprob_5st(2, 2);
    t1 = s1 + hmm_tprob_5st(1, 2);
    t2 = s0 + hmm_tprob_5st(0, 2);
    if (t0 > t1) {
        if (t2 > t0) {
            s2 = t2;
            hmm_history(hmm, 2)  = hmm_in_history(hmm);
        } else
            s2 = t0;
    } else {
        if (t2 > t1) {
            s2 = t2;
            hmm_history(hmm, 2)  = hmm_in_history(hmm);
        } else {
            s2 = t1;
            hmm_history(hmm, 2)  = hmm_history(hmm, 1);
        }
    }
    if (s2 < WORST_SCORE) s2 = WORST_SCORE;
    if (s2 > bestScore) bestScore = s2;
    hmm_score(hmm, 2) = s2;


    /* All transitions into state 1 */
    t0 = s1 + hmm_tprob_5st(1, 1);
    t1 = s0 + hmm_tprob_5st(0, 1);
    if (t0 > t1) {
        s1 = t0;
    } else {
        s1 = t1;
        hmm_history(hmm, 1)  = hmm_in_history(hmm);
    }
    if (s1 < WORST_SCORE) s1 = WORST_SCORE;
    if (s1 > bestScore) bestScore = s1;
    hmm_score(hmm, 1) = s1;

    /* All transitions into state 0 */
    s0 = s0 + hmm_tprob_5st(0, 0);
    if (s0 < WORST_SCORE) s0 = WORST_SCORE;
    if (s0 > bestScore) bestScore = s0;
    hmm_in_score(hmm) = s0;

    hmm_bestscore(hmm) = bestScore;
    return bestScore;
}